

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeSensInit(void *cvode_mem,int Ns,int ism,CVSensRhsFn fS,N_Vector *yS0)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  SUNNonlinearSolver NLS;
  ulong uVar7;
  int error_code;
  char *msgfmt;
  size_t __size;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar12;
  long lVar11;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar12 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar3 = 0x581;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    if (Ns < 1) {
      msgfmt = "NS <= 0 illegal.";
      iVar12 = -0x16;
      error_code = -0x16;
      iVar3 = 0x593;
    }
    else {
      *(int *)((long)cvode_mem + 0x90) = Ns;
      if (ism == 3) {
        msgfmt = "Illegal ism = CV_STAGGERED1 for CVodeSensInit.";
        iVar12 = -0x16;
        error_code = -0x16;
        iVar3 = 0x59d;
      }
      else if (ism - 3U < 0xfffffffe) {
        msgfmt = 
        "Illegal value for ism. Legal values are: CV_SIMULTANEOUS, CV_STAGGERED and CV_STAGGERED1.";
        iVar12 = -0x16;
        error_code = -0x16;
        iVar3 = 0x5a6;
      }
      else {
        *(int *)((long)cvode_mem + 0x94) = ism;
        if (yS0 == (N_Vector *)0x0) {
          msgfmt = "yS0 = NULL illegal.";
          iVar12 = -0x16;
          error_code = -0x16;
          iVar3 = 0x5b0;
        }
        else {
          *(undefined4 *)((long)cvode_mem + 0xb4) = 2;
          *(undefined8 *)((long)cvode_mem + 0xa0) = 0;
          bVar8 = fS == (CVSensRhsFn)0x0;
          if (bVar8) {
            fS = cvSensRhsInternalDQ;
            pvVar4 = cvode_mem;
          }
          else {
            pvVar4 = *(void **)((long)cvode_mem + 0x18);
          }
          *(uint *)((long)cvode_mem + 0xb0) = (uint)bVar8;
          *(CVSensRhsFn *)((long)cvode_mem + 0x98) = fS;
          *(void **)((long)cvode_mem + 0xa8) = pvVar4;
          *(undefined4 *)((long)cvode_mem + 0x318) = 0;
          iVar3 = cvSensAllocVectors((CVodeMem)cvode_mem,*yS0);
          if (iVar3 != 0) {
            if (Ns != 1) {
              free(*(void **)((long)cvode_mem + 0xa50));
              *(undefined8 *)((long)cvode_mem + 0xa50) = 0;
              free(*(void **)((long)cvode_mem + 0xa58));
              *(undefined8 *)((long)cvode_mem + 0xa58) = 0;
              free(*(void **)((long)cvode_mem + 0xa60));
              __size = (ulong)(uint)(Ns * 0xd) << 3;
              pvVar4 = malloc(__size);
              *(void **)((long)cvode_mem + 0xa50) = pvVar4;
              pvVar5 = malloc(__size);
              *(void **)((long)cvode_mem + 0xa58) = pvVar5;
              pvVar6 = malloc(__size);
              *(void **)((long)cvode_mem + 0xa60) = pvVar6;
              if ((pvVar4 == (void *)0x0) || (pvVar5 == (void *)0x0 || pvVar6 == (void *)0x0)) {
                cvSensFreeVectors((CVodeMem)cvode_mem);
                msgfmt = "A memory request failed.";
                iVar12 = -0x14;
                error_code = -0x14;
                iVar3 = 0x5e7;
                goto LAB_00114288;
              }
            }
            auVar2 = _DAT_00138040;
            lVar1 = *(long *)((long)cvode_mem + 0xa50);
            lVar11 = (ulong)(uint)Ns - 1;
            auVar9._8_4_ = (int)lVar11;
            auVar9._0_8_ = lVar11;
            auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
            uVar7 = 0;
            auVar9 = auVar9 ^ _DAT_00138040;
            auVar10 = _DAT_00138030;
            do {
              bVar8 = auVar9._0_4_ < SUB164(auVar10 ^ auVar2,0);
              iVar3 = auVar9._4_4_;
              iVar12 = SUB164(auVar10 ^ auVar2,4);
              if ((bool)(~(iVar3 < iVar12 || iVar12 == iVar3 && bVar8) & 1)) {
                *(undefined8 *)(lVar1 + uVar7 * 8) = 0x3ff0000000000000;
              }
              if (iVar3 >= iVar12 && (iVar12 != iVar3 || !bVar8)) {
                *(undefined8 *)(lVar1 + 8 + uVar7 * 8) = 0x3ff0000000000000;
              }
              uVar7 = uVar7 + 2;
              lVar11 = auVar10._8_8_;
              auVar10._0_8_ = auVar10._0_8_ + 2;
              auVar10._8_8_ = lVar11 + 2;
            } while ((Ns + 1U & 0xfffffffe) != uVar7);
            iVar3 = N_VScaleVectorArray(Ns,lVar1,yS0,*(undefined8 *)((long)cvode_mem + 0x288));
            if (iVar3 != 0) {
              return -0x1c;
            }
            uVar7 = 0;
            *(undefined8 *)((long)cvode_mem + 0x668) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6b8) = 0;
            *(undefined8 *)((long)cvode_mem + 0x680) = 0;
            *(undefined8 *)((long)cvode_mem + 0x698) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6d0) = 0;
            *(undefined1 (*) [16])((long)cvode_mem + 0x640) = (undefined1  [16])0x0;
            lVar11 = *(long *)((long)cvode_mem + 0xc0);
            lVar1 = *(long *)((long)cvode_mem + 200);
            do {
              *(int *)(lVar1 + uVar7 * 4) = (int)uVar7;
              *(undefined8 *)(lVar11 + uVar7 * 8) = 0x3ff0000000000000;
              uVar7 = uVar7 + 1;
            } while ((uint)Ns != uVar7);
            *(undefined4 *)((long)cvode_mem + 0x8c) = 1;
            *(undefined4 *)((long)cvode_mem + 0x860) = 1;
            if (ism == 1) {
              NLS = SUNNonlinSol_NewtonSens
                              (Ns + 1U,*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
              if (NLS == (SUNNonlinearSolver)0x0) {
LAB_001146a6:
                cvProcessError((CVodeMem)cvode_mem,-0x14,0x61c,"CVodeSensInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"A memory request failed.");
                cvSensFreeVectors((CVodeMem)cvode_mem);
                return -0x14;
              }
              iVar3 = CVodeSetNonlinearSolverSensSim(cvode_mem,NLS);
              if (iVar3 != 0) {
LAB_00114666:
                cvProcessError((CVodeMem)cvode_mem,iVar3,0x62c,"CVodeSensInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"Setting the nonlinear solver failed");
                cvSensFreeVectors((CVodeMem)cvode_mem);
                SUNNonlinSolFree(NLS);
                return -0x14;
              }
              *(undefined4 *)((long)cvode_mem + 0x740) = 1;
            }
            else {
              NLS = SUNNonlinSol_NewtonSens(Ns,*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
              if (NLS == (SUNNonlinearSolver)0x0) goto LAB_001146a6;
              iVar3 = CVodeSetNonlinearSolverSensStg(cvode_mem,NLS);
              if (iVar3 != 0) goto LAB_00114666;
              *(undefined4 *)((long)cvode_mem + 0x750) = 1;
            }
            return 0;
          }
          msgfmt = "A memory request failed.";
          iVar12 = -0x14;
          error_code = -0x14;
          iVar3 = 0x5d0;
        }
      }
    }
  }
  else {
    msgfmt = "Sensitivity analysis already initialized.";
    iVar12 = -0x16;
    error_code = -0x16;
    iVar3 = 0x58a;
  }
LAB_00114288:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar3,"CVodeSensInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar12;
}

Assistant:

int CVodeSensInit(void* cvode_mem, int Ns, int ism, CVSensRhsFn fS, N_Vector* yS0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  int is, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if CVodeSensInit or CVodeSensInit1 was already called */

  if (cv_mem->cv_SensMallocDone)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_SENSINIT_2);
    return (CV_ILL_INPUT);
  }

  /* Check if Ns is legal */

  if (Ns <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NS);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_Ns = Ns;

  /* Check if ism is compatible */

  if (ism == CV_STAGGERED1)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM_IFS);
    return (CV_ILL_INPUT);
  }

  /* Check if ism is legal */

  if ((ism != CV_SIMULTANEOUS) && (ism != CV_STAGGERED))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_ism = ism;

  /* Check if yS0 is non-null */

  if (yS0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_YS0);
    return (CV_ILL_INPUT);
  }

  /* Store sensitivity RHS-related data */

  cv_mem->cv_ifS = CV_ALLSENS;
  cv_mem->cv_fS1 = NULL;

  if (fS == NULL)
  {
    cv_mem->cv_fSDQ    = SUNTRUE;
    cv_mem->cv_fS      = cvSensRhsInternalDQ;
    cv_mem->cv_fS_data = cvode_mem;
  }
  else
  {
    cv_mem->cv_fSDQ    = SUNFALSE;
    cv_mem->cv_fS      = fS;
    cv_mem->cv_fS_data = cv_mem->cv_user_data;
  }

  /* No memory allocation for STAGGERED1 */

  cv_mem->cv_stgr1alloc = SUNFALSE;

  /* Allocate the vectors (using yS0[0] as a template) */

  allocOK = cvSensAllocVectors(cv_mem, yS0[0]);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Check if larger temporary work arrays are needed for fused vector ops */
  if (Ns * L_MAX > L_MAX)
  {
    free(cv_mem->cv_cvals);
    cv_mem->cv_cvals = NULL;
    free(cv_mem->cv_Xvecs);
    cv_mem->cv_Xvecs = NULL;
    free(cv_mem->cv_Zvecs);
    cv_mem->cv_Zvecs = NULL;

    cv_mem->cv_cvals = (sunrealtype*)malloc((Ns * L_MAX) * sizeof(sunrealtype));
    cv_mem->cv_Xvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));
    cv_mem->cv_Zvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));

    if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
        (cv_mem->cv_Zvecs == NULL))
    {
      cvSensFreeVectors(cv_mem);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }

  /*----------------------------------------------
    All error checking is complete at this point
    -----------------------------------------------*/

  /* Initialize znS[0] in the history array */

  for (is = 0; is < Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(Ns, cv_mem->cv_cvals, yS0, cv_mem->cv_znS[0]);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* Initialize all sensitivity related counters */

  cv_mem->cv_nfSe     = 0;
  cv_mem->cv_nfeS     = 0;
  cv_mem->cv_ncfnS    = 0;
  cv_mem->cv_netfS    = 0;
  cv_mem->cv_nniS     = 0;
  cv_mem->cv_nnfS     = 0;
  cv_mem->cv_nsetupsS = 0;

  /* Set default values for plist and pbar */

  for (is = 0; is < Ns; is++)
  {
    cv_mem->cv_plist[is] = is;
    cv_mem->cv_pbar[is]  = ONE;
  }

  /* Sensitivities will be computed */

  cv_mem->cv_sensi          = SUNTRUE;
  cv_mem->cv_SensMallocDone = SUNTRUE;

  /* create a Newton nonlinear solver object by default */
  if (ism == CV_SIMULTANEOUS)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns + 1, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else
  {
    NLS = SUNNonlinSol_NewtonSens(Ns, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }

  /* check that the nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvSensFreeVectors(cv_mem);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  if (ism == CV_SIMULTANEOUS)
  {
    retval = CVodeSetNonlinearSolverSensSim(cv_mem, NLS);
  }
  else { retval = CVodeSetNonlinearSolverSensStg(cv_mem, NLS); }

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvSensFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  if (ism == CV_SIMULTANEOUS) { cv_mem->ownNLSsim = SUNTRUE; }
  else { cv_mem->ownNLSstg = SUNTRUE; }

  /* Sensitivity initialization was successfull */
  return (CV_SUCCESS);
}